

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O3

mp_int * rsa_privkey_op(mp_int *input,RSAKey *key)

{
  uint yes;
  mp_int *r;
  mp_int *r_00;
  mp_int *exponent;
  mp_int *pmVar1;
  mp_int *pmVar2;
  mp_int *b;
  mp_int *a;
  mp_int *pmVar3;
  mp_int *pmVar4;
  mp_int *pmVar5;
  mp_int *pmVar6;
  
  pmVar6 = key->modulus;
  pmVar1 = key->private_exponent;
  pmVar3 = key->p;
  pmVar4 = key->q;
  pmVar5 = key->iqmp;
  r = mp_copy(pmVar3);
  mp_sub_integer_into(r,r,1);
  r_00 = mp_copy(pmVar4);
  mp_sub_integer_into(r_00,r_00,1);
  exponent = mp_mod(pmVar1,r);
  pmVar1 = mp_mod(pmVar1,r_00);
  pmVar2 = mp_mod(input,pmVar3);
  b = mp_modpow(pmVar2,exponent,pmVar3);
  mp_free(pmVar2);
  pmVar2 = mp_mod(input,pmVar4);
  a = mp_modpow(pmVar2,pmVar1,pmVar4);
  mp_free(pmVar2);
  yes = mp_cmp_hs(a,b);
  mp_cond_add_into(b,b,pmVar3,yes);
  pmVar3 = mp_sub(b,a);
  pmVar4 = mp_mul(pmVar5,pmVar4);
  pmVar5 = mp_mul(pmVar4,pmVar3);
  mp_add_into(pmVar5,pmVar5,a);
  pmVar6 = mp_mod(pmVar5,pmVar6);
  mp_free(r);
  mp_free(r_00);
  mp_free(exponent);
  mp_free(pmVar1);
  mp_free(b);
  mp_free(a);
  mp_free(pmVar3);
  mp_free(pmVar4);
  mp_free(pmVar5);
  return pmVar6;
}

Assistant:

static mp_int *rsa_privkey_op(mp_int *input, RSAKey *key)
{
    return crt_modpow(input, key->private_exponent,
                      key->modulus, key->p, key->q, key->iqmp);
}